

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04b.cpp
# Opt level: O0

int day4b::northpole_room_id(string *input)

{
  bool bVar1;
  int id_00;
  istream *piVar2;
  allocator<char> local_249;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  string local_228;
  int local_208;
  allocator<char> local_201;
  int id;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  undefined1 local_1e8 [8];
  string name;
  string local_1b8 [8];
  string line;
  istringstream stream;
  string *input_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)input,_S_in);
  std::__cxx11::string::string(local_1b8);
  do {
    piVar2 = std::operator>>((istream *)(line.field_2._M_local_buf + 8),local_1b8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) {
      input_local._4_4_ = 0;
      break;
    }
    local_1f0._M_current = (char *)std::__cxx11::string::begin();
    _id = (char *)std::__cxx11::string::end();
    local_1f8 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&id,0xb);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)local_1e8,local_1f0,local_1f8,&local_201);
    std::allocator<char>::~allocator(&local_201);
    local_238._M_current = (char *)std::__cxx11::string::end();
    local_230 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_238,10);
    local_248._M_current = (char *)std::__cxx11::string::end();
    local_240 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_248,7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)&local_228,local_230,local_240,&local_249);
    id_00 = std::__cxx11::stoi(&local_228,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_249);
    local_208 = id_00;
    decipher_name((string *)local_1e8,id_00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1e8,"northpole-object-storage");
    if (bVar1) {
      input_local._4_4_ = local_208;
    }
    std::__cxx11::string::~string((string *)local_1e8);
  } while (!bVar1);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  return input_local._4_4_;
}

Assistant:

int northpole_room_id(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		while(stream >> line) {
			std::string name{line.begin(), line.end() - 11};
			int id = std::stoi(std::string{line.end() - 10, line.end() - 7});
			decipher_name(name, id);
			if(name == "northpole-object-storage") {
				return id;
			}
		}
		return 0;
	}